

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableSetBgColor(ImGuiTableBgTarget bg_target,ImU32 color,int column_n)

{
  float *pfVar1;
  char cVar2;
  ImGuiTable *pIVar3;
  ImGuiTableCellData *pIVar4;
  ulong uVar5;
  ImU32 IVar6;
  
  if (bg_target != 0) {
    uVar5 = (ulong)(uint)column_n;
    pIVar3 = GImGui->CurrentTable;
    IVar6 = 0;
    if (color != 0x1000000) {
      IVar6 = color;
    }
    if (bg_target - 3U < 2) {
      pfVar1 = &(pIVar3->InnerClipRect).Max.y;
      if (pIVar3->RowPosY1 < *pfVar1 || pIVar3->RowPosY1 == *pfVar1) {
        if (column_n != -1) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x27c3,"TableSetBgColor","ImGui ASSERT FAILED: %s","column_n == -1");
        }
        pIVar3->RowBgColor[bg_target == 4] = IVar6;
      }
    }
    else {
      if (bg_target != 5) goto LAB_001c8b07;
      pfVar1 = &(pIVar3->InnerClipRect).Max.y;
      if (pIVar3->RowPosY1 < *pfVar1 || pIVar3->RowPosY1 == *pfVar1) {
        if (column_n == -1) {
          uVar5 = (ulong)(uint)pIVar3->CurrentColumn;
        }
        if ((pIVar3->VisibleUnclippedMaskByIndex >> (uVar5 & 0x3f) & 1) != 0) {
          cVar2 = pIVar3->RowCellDataCount;
          pIVar3->RowCellDataCount = cVar2 + '\x01';
          pIVar4 = ImSpan<ImGuiTableCellData>::operator[](&pIVar3->RowCellData,(int)cVar2);
          pIVar4->BgColor = IVar6;
          pIVar4->Column = (ImS8)uVar5;
        }
      }
    }
    return;
  }
  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
              ,0x27a9,"TableSetBgColor","ImGui ASSERT FAILED: %s",
              "bg_target != ImGuiTableBgTarget_None");
LAB_001c8b07:
  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
              ,0x27c9,"TableSetBgColor","ImGui ASSERT FAILED: %s","0");
  return;
}

Assistant:

void ImGui::TableSetBgColor(ImGuiTableBgTarget bg_target, ImU32 color, int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(bg_target != ImGuiTableBgTarget_None);

    if (color == IM_COL32_DISABLE)
        color = 0;

    // We cannot draw neither the cell or row background immediately as we don't know the row height at this point in time.
    switch (bg_target)
    {
    case ImGuiTableBgTarget_CellBg:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        if (column_n == -1)
            column_n = table->CurrentColumn;
        if ((table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)) == 0)
            return;
        ImGuiTableCellData* cell_data = &table->RowCellData[table->RowCellDataCount++];
        cell_data->BgColor = color;
        cell_data->Column = (ImS8)column_n;
        break;
    }
    case ImGuiTableBgTarget_RowBg0:
    case ImGuiTableBgTarget_RowBg1:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        IM_ASSERT(column_n == -1);
        int bg_idx = (bg_target == ImGuiTableBgTarget_RowBg1) ? 1 : 0;
        table->RowBgColor[bg_idx] = color;
        break;
    }
    default:
        IM_ASSERT(0);
    }
}